

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O3

int __thiscall DetectorSS::PointQueryMerge(DetectorSS *this,uint32_t key)

{
  int iVar1;
  uchar **ppuVar2;
  int *piVar3;
  int iVar4;
  uchar *dst;
  uint64_t uVar5;
  int iVar6;
  DetectorSS *pDVar7;
  long lVar8;
  ulong __n;
  long lVar9;
  uint32_t hashval [4];
  uint32_t hkey [3];
  undefined1 local_64 [44];
  uint32_t local_38;
  uint32_t local_34;
  
  __n = (ulong)((this->ss_).offsets[(this->ss_).c] + 7 >> 3);
  local_64._0_4_ = key;
  dst = (uchar *)operator_new__(__n);
  memset(dst,0,__n);
  pDVar7 = (DetectorSS *)(local_64 + 0x28);
  local_64._12_8_ = 0;
  local_64._20_8_ = 0;
  local_64._40_4_ = key;
  local_38 = key;
  local_34 = key;
  MurmurHash3_x64_128(pDVar7,0xc,(uint32_t)*(this->ss_).hash,local_64 + 0xc);
  lVar9 = (long)(this->ss_).tdepth;
  if (0 < lVar9) {
    local_64._4_8_ = SEXT48((this->ss_).width);
    ppuVar2 = (this->ss_).counts;
    piVar3 = (this->ss_).offsets;
    iVar4 = (this->ss_).c;
    lVar8 = 0;
    do {
      iVar6 = (int)((ulong)*(uint *)(local_64 + lVar8 * 4 + 0xc) * local_64._4_8_ >> 0x20);
      if (lVar8 == 0) {
        iVar1 = piVar3[iVar4];
        Copybmp(pDVar7,dst,*ppuVar2,iVar6 * iVar1,iVar1);
      }
      else {
        iVar1 = piVar3[iVar4];
        Intersec(pDVar7,dst,ppuVar2[lVar8],iVar6 * iVar1,iVar1);
      }
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
  }
  if (4 < (this->ss_).depth) {
    lVar9 = 4;
    do {
      iVar4 = (this->ss_).lgn;
      iVar6 = iVar4 + 7;
      if (-1 < iVar4) {
        iVar6 = iVar4;
      }
      pDVar7 = (DetectorSS *)local_64;
      uVar5 = MurmurHash64A((DetectorSS *)local_64,iVar6 >> 3,(this->ss_).hash[lVar9]);
      iVar4 = (this->ss_).offsets[(this->ss_).c];
      Intersec(pDVar7,dst,(this->ss_).counts[lVar9],
               (int)((long)(this->ss_).width * (uVar5 & 0xffffffff) >> 0x20) * iVar4,iVar4);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->ss_).depth);
  }
  iVar4 = Estimate(this,0,dst);
  operator_delete__(dst);
  return iVar4;
}

Assistant:

int DetectorSS::PointQueryMerge(uint32_t key) {
	int ret = 0;
	unsigned char* mcount = new unsigned char[(ss_.offsets[ss_.c] + 7) >> 3]();
	uint32_t hkey[3] = { key, key, key };
	uint32_t hashval[4] = { 0 };
	MurmurHash3_x64_128((unsigned char*)hkey, 12, ss_.hash[0], (unsigned char*)hashval);
	for (int i = 0; i < ss_.tdepth; i++) {
		unsigned bucket = (uint32_t)hashval[i] * (unsigned long)ss_.width >> 32;
		if (i == 0) {
			Copybmp(mcount, ss_.counts[i], bucket * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
		}
		else
			Intersec(mcount, ss_.counts[i], bucket * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
	}
	for (int i = 4; i < ss_.depth; i++) {
		unsigned bucket = MurmurHash64A((unsigned char*)(&key), ss_.lgn / 8, ss_.hash[i]);
		bucket = (bucket * (unsigned long)ss_.width) >> 32;
		Intersec(mcount, ss_.counts[i], bucket * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
	}
	ret = Estimate(0, mcount);
	delete[] mcount;
	return ret;
}